

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::DumpFunctionId(FunctionBody *this,bool pad)

{
  uint uVar1;
  SourceContextInfo *pSVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  FunctionInfo *pFVar6;
  char16_t *pcVar7;
  char16_t *pcVar8;
  
  pSVar2 = (((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
             m_srcInfo).ptr)->sourceContextInfo).ptr;
  uVar1 = pSVar2->sourceContextId;
  if (uVar1 == 0xffffffff) {
    pFVar6 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if ((pSVar2->dwHostSourceContext == 0xffffffffffffffff) ||
       ((pSVar2->isHostDynamicDocument & 1U) != 0)) {
      pcVar7 = L"Dy.%-3d";
      pcVar8 = L"Dyn#%d";
    }
    else {
      pcVar7 = L"%-5d";
      pcVar8 = L"#%d";
    }
    if (pad) {
      pcVar8 = pcVar7;
    }
    if (pFVar6 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar4) goto LAB_007671ff;
      *puVar5 = 0;
      pFVar6 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    Output::Print(pcVar8,(ulong)pFVar6->functionId);
    return;
  }
  pcVar8 = L"#%d.%d";
  if (pad) {
    pcVar8 = L"%2d.%-3d";
  }
  pFVar6 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar6 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) {
LAB_007671ff:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
    pFVar6 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  Output::Print(pcVar8,(ulong)uVar1,(ulong)pFVar6->functionId);
  return;
}

Assistant:

void FunctionBody::DumpFunctionId(bool pad)
    {
        uint sourceContextId = this->GetSourceContextInfo()->sourceContextId;
        if (sourceContextId == Js::Constants::NoSourceContext)
        {
            if (this->IsDynamicScript())
            {
                Output::Print(pad? _u("Dy.%-3d") : _u("Dyn#%d"), this->GetLocalFunctionId());
            }
            else
            {
                // Function from LoadFile
                Output::Print(pad? _u("%-5d") : _u("#%d"), this->GetLocalFunctionId());
            }
        }
        else
        {
            Output::Print(pad? _u("%2d.%-3d") : _u("#%d.%d"), sourceContextId, this->GetLocalFunctionId());
        }
    }